

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O0

void async_example(void)

{
  int i;
  shared_ptr<spdlog::logger> async_file;
  file_event_handlers *in_stack_fffffffffffffed0;
  allocator *args;
  logger *this;
  string_view in_stack_fffffffffffffee8;
  int local_104;
  file_event_handlers *in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff2f;
  filename_t *in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff38;
  allocator local_79;
  string local_78 [55];
  undefined1 local_41 [49];
  char *local_10;
  basic_string_view<char> *local_8;
  
  this = (logger *)local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_41 + 1),"async_file_logger",(allocator *)this);
  args = &local_79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"logs/async_log.txt",args);
  spdlog::file_event_handlers::file_event_handlers(in_stack_fffffffffffffed0);
  spdlog::basic_logger_mt<spdlog::async_factory_impl<(spdlog::async_overflow_policy)0>>
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff2f,
             in_stack_ffffffffffffff20);
  spdlog::file_event_handlers::~file_event_handlers(in_stack_fffffffffffffed0);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string((string *)(local_41 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_41);
  for (local_104 = 1; local_104 < 0x65; local_104 = local_104 + 1) {
    std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x10d951);
    local_8 = (basic_string_view<char> *)&stack0xfffffffffffffee8;
    local_10 = "Async message #{}";
    fmt::v11::basic_string_view<char>::basic_string_view(local_8,"Async message #{}",0x11);
    spdlog::logger::info<int&>(this,(format_string_t<int_&>)in_stack_fffffffffffffee8,(int *)args);
  }
  std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x10da7c);
  return;
}

Assistant:

void async_example() {
    // Default thread pool settings can be modified *before* creating the async logger:
    // spdlog::init_thread_pool(32768, 1); // queue with max 32k items 1 backing thread.
    auto async_file =
        spdlog::basic_logger_mt<spdlog::async_factory>("async_file_logger", "logs/async_log.txt");
    // alternatively:
    // auto async_file =
    // spdlog::create_async<spdlog::sinks::basic_file_sink_mt>("async_file_logger",
    // "logs/async_log.txt");

    for (int i = 1; i < 101; ++i) {
        async_file->info("Async message #{}", i);
    }
}